

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Segment::AddFrame
          (Segment *this,uint8_t *data,uint64_t length,uint64_t track_number,uint64_t timestamp,
          bool is_key)

{
  bool bVar1;
  undefined1 local_a8 [8];
  Frame frame;
  bool is_key_local;
  uint64_t timestamp_local;
  uint64_t track_number_local;
  uint64_t length_local;
  uint8_t *data_local;
  Segment *this_local;
  
  if (data == (uint8_t *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    frame._103_1_ = is_key;
    Frame::Frame((Frame *)local_a8);
    bVar1 = Frame::Init((Frame *)local_a8,data,length);
    if (bVar1) {
      Frame::set_track_number((Frame *)local_a8,track_number);
      Frame::set_timestamp((Frame *)local_a8,timestamp);
      Frame::set_is_key((Frame *)local_a8,(bool)(frame._103_1_ & 1));
      this_local._7_1_ = AddGenericFrame(this,(Frame *)local_a8);
    }
    else {
      this_local._7_1_ = false;
    }
    Frame::~Frame((Frame *)local_a8);
  }
  return this_local._7_1_;
}

Assistant:

bool Segment::AddFrame(const uint8_t* data, uint64_t length,
                       uint64_t track_number, uint64_t timestamp, bool is_key) {
  if (!data)
    return false;

  Frame frame;
  if (!frame.Init(data, length))
    return false;
  frame.set_track_number(track_number);
  frame.set_timestamp(timestamp);
  frame.set_is_key(is_key);
  return AddGenericFrame(&frame);
}